

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<UF>::PerformLabeling(DRAG<UF> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  undefined4 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint *puVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  uint local_e8;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar23 = *(uint *)&pMVar4->field_0x8;
  uVar11 = (ulong)uVar23;
  iVar18 = *(int *)&pMVar4->field_0xc;
  lVar26 = (long)iVar18;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  uVar13 = 1;
  if (0 < (int)uVar23) {
    uVar16 = 0;
    do {
      if (0 < iVar18) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar24 = **(long **)&pMVar4->field_0x48;
        lVar21 = lVar24 * uVar16 + *(long *)&pMVar4->field_0x10;
        lVar22 = lVar21 - lVar24;
        lVar9 = lVar22 - lVar24;
        lVar24 = lVar24 + lVar21;
        lVar29 = **(long **)&pMVar5->field_0x48;
        lVar25 = lVar29 * uVar16 + *(long *)&pMVar5->field_0x10;
        lVar31 = lVar25 + lVar29 * -2;
        lVar29 = lVar9 + -1;
        uVar10 = uVar16 | 1;
        uVar28 = 0;
        do {
          puVar20 = UF::P_;
          if (*(char *)(lVar21 + uVar28) == '\0') {
            if ((uVar10 < uVar11) && (*(char *)(lVar24 + uVar28) != '\0')) {
              uVar8 = uVar28 | 1;
              if (((long)uVar8 < lVar26) && (*(char *)(lVar21 + uVar8) != '\0')) {
                if (uVar28 != 0) {
                  if (*(char *)((uVar28 - 1) + lVar21) == '\0') {
                    if (*(char *)(lVar24 + -1 + uVar28) == '\0') goto LAB_001149a4;
                    if (uVar16 == 0) goto LAB_0011508e;
                    if (*(char *)(lVar22 + uVar8) == '\0') {
                      if ((lVar26 <= (long)(uVar28 + 2)) || (*(char *)(lVar22 + uVar28 + 2) == '\0')
                         ) {
                        if (*(char *)(lVar22 + uVar28) == '\0') goto LAB_0011508e;
                        if (*(char *)((uVar28 - 2) + lVar21) == '\0') {
                          uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                          do {
                            uVar13 = uVar23;
                            uVar8 = (ulong)uVar13;
                            uVar23 = UF::P_[uVar8];
                            uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar8] < uVar13);
                          do {
                            uVar23 = uVar30;
                            uVar19 = (ulong)uVar23;
                            uVar30 = UF::P_[uVar19];
                          } while (UF::P_[uVar19] < uVar23);
                          goto LAB_00114b84;
                        }
                        goto LAB_001148f7;
                      }
                      if (*(char *)(lVar9 + uVar8) == '\0') {
                        if (*(char *)(lVar22 + uVar28) == '\0') {
                          uVar23 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                          do {
                            uVar13 = uVar23;
                            uVar8 = (ulong)uVar13;
                            uVar23 = UF::P_[uVar8];
                            uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar8] < uVar13);
                          do {
                            uVar23 = uVar30;
                            uVar19 = (ulong)uVar23;
                            uVar30 = UF::P_[uVar19];
                          } while (UF::P_[uVar19] < uVar23);
                        }
                        else {
                          if (*(char *)(lVar21 + -2 + uVar28) == '\0') {
                            uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                            do {
                              uVar30 = uVar23;
                              uVar23 = UF::P_[uVar30];
                              uVar13 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                            } while (UF::P_[uVar30] < uVar30);
                            do {
                              uVar23 = uVar13;
                              uVar13 = UF::P_[uVar23];
                            } while (UF::P_[uVar23] < uVar23);
                            if (uVar30 < uVar23) {
                              UF::P_[uVar23] = uVar30;
                              uVar23 = uVar30;
                            }
                            else {
                              UF::P_[uVar30] = uVar23;
                            }
                            do {
                              uVar13 = uVar23;
                              uVar8 = (ulong)uVar13;
                              uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                              uVar23 = puVar20[uVar8];
                            } while (puVar20[uVar8] < uVar13);
                            do {
                              uVar23 = uVar30;
                              uVar19 = (ulong)uVar23;
                              uVar30 = puVar20[uVar19];
                            } while (puVar20[uVar19] < uVar23);
                            goto LAB_0011541c;
                          }
                          if (*(char *)(lVar22 + -1 + uVar28) == '\0') goto LAB_001150e5;
                          uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                          do {
                            uVar13 = uVar23;
                            uVar8 = (ulong)uVar13;
                            uVar23 = UF::P_[uVar8];
                            uVar30 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                          } while (UF::P_[uVar8] < uVar13);
                          do {
                            uVar23 = uVar30;
                            uVar19 = (ulong)uVar23;
                            uVar30 = UF::P_[uVar19];
                          } while (UF::P_[uVar19] < uVar23);
                        }
                        goto LAB_00114b84;
                      }
                    }
                    if (*(char *)((uVar28 - 2) + lVar21) != '\0') goto LAB_00114a97;
                    uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
LAB_00114b84:
                    if (uVar23 <= uVar13) {
                      UF::P_[uVar8] = uVar23;
                      goto LAB_00114ec3;
                    }
                    goto LAB_00114eb7;
                  }
                  if (uVar16 != 0) {
                    if (*(char *)(lVar22 + uVar8) == '\0') goto LAB_001149fe;
                    goto LAB_001148dc;
                  }
LAB_0011508e:
                  uVar7 = *(undefined4 *)(lVar25 + -8 + uVar28 * 4);
                  goto LAB_00115093;
                }
                uVar8 = 1;
LAB_001149a4:
                if (((uVar16 != 0) && ((long)uVar8 < lVar26)) && (*(char *)(lVar22 + uVar8) != '\0')
                   ) goto LAB_00114ba2;
                if ((uVar16 == 0) || (lVar26 <= (long)(uVar28 + 2))) {
                  if (uVar16 == 0) goto LAB_00114c0d;
                }
                else if (*(char *)(lVar22 + uVar28 + 2) != '\0') {
                  if (*(char *)(lVar22 + uVar28) == '\0') goto LAB_00114dc8;
                  goto LAB_00114b50;
                }
                if (*(char *)(lVar22 + uVar28) != '\0') goto LAB_00114ba2;
              }
              else if ((uVar28 != 0) &&
                      ((*(char *)((uVar28 - 1) + lVar24) != '\0' ||
                       (*(char *)(lVar21 + -1 + uVar28) != '\0')))) goto LAB_0011508e;
LAB_00114c0d:
              UF::P_[UF::length_] = UF::length_;
              uVar23 = UF::length_ + 1;
              *(uint *)(lVar25 + uVar28 * 4) = UF::length_;
              UF::length_ = uVar23;
            }
            else {
              uVar8 = uVar28 | 1;
              if ((long)uVar8 < lVar26) {
                if (*(char *)(lVar21 + uVar8) != '\0') goto LAB_001149a4;
                if ((uVar10 < uVar11) && (*(char *)(lVar24 + uVar8) != '\0')) goto LAB_00114c0d;
              }
              *(undefined4 *)(lVar25 + uVar28 * 4) = 0;
            }
          }
          else if (uVar28 == 0) {
LAB_00114ad7:
            uVar8 = uVar28 | 1;
            if ((uVar16 == 0) || ((lVar26 <= (long)uVar8 || (*(char *)(lVar22 + uVar8) == '\0')))) {
              if (((long)uVar8 < lVar26) &&
                 (((*(char *)(lVar21 + uVar8) != '\0' && (uVar16 != 0)) &&
                  ((long)(uVar28 + 2) < lVar26)))) {
                if (*(char *)(lVar22 + uVar28 + 2) != '\0') {
                  if (*(char *)(lVar22 + uVar28) == '\0') {
                    if ((uVar28 == 0) || (*(char *)(lVar22 + -1 + uVar28) == '\0')) {
LAB_00114dc8:
                      uVar7 = *(undefined4 *)(lVar31 + 8 + uVar28 * 4);
                      goto LAB_00115093;
                    }
                    if (*(char *)(lVar9 + uVar8) == '\0') {
                      uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                      do {
                        uVar13 = uVar23;
                        uVar8 = (ulong)uVar13;
                        uVar23 = UF::P_[uVar8];
                        uVar30 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                      } while (UF::P_[uVar8] < uVar13);
                      do {
                        uVar23 = uVar30;
                        uVar19 = (ulong)uVar23;
                        uVar30 = UF::P_[uVar19];
                      } while (UF::P_[uVar19] < uVar23);
                      goto LAB_00114b84;
                    }
                    goto LAB_00114b0f;
                  }
LAB_00114b50:
                  if ((lVar26 <= (long)uVar8) || (*(char *)(lVar9 + uVar8) == '\0')) {
                    uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114b84;
                  }
                  goto LAB_00114ba2;
                }
              }
              else if (uVar16 == 0) goto LAB_00114c0d;
              if (*(char *)(lVar22 + uVar28) != '\0') goto LAB_00114ba2;
              if ((uVar16 == 0 || uVar28 == 0) || (*(char *)(lVar22 + -1 + uVar28) == '\0'))
              goto LAB_00114c0d;
LAB_00114e80:
              uVar7 = *(undefined4 *)(lVar31 + -8 + uVar28 * 4);
            }
            else {
              if (((*(char *)(lVar22 + uVar28) == '\0') && (uVar28 != 0)) &&
                 (*(char *)(lVar22 + -1 + uVar28) != '\0')) {
LAB_00114b0f:
                if (*(char *)(lVar9 + uVar28) == '\0') {
LAB_00114e8e:
                  uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar23 = UF::P_[uVar8];
                    uVar30 = *(uint *)(lVar31 + uVar28 * 4);
                  } while (UF::P_[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = UF::P_[uVar19];
                  } while (UF::P_[uVar19] < uVar23);
                  goto LAB_00114eb2;
                }
                goto LAB_00114e80;
              }
LAB_00114ba2:
              uVar7 = *(undefined4 *)(lVar31 + uVar28 * 4);
            }
LAB_00115093:
            *(undefined4 *)(lVar25 + uVar28 * 4) = uVar7;
          }
          else {
            if (*(char *)(lVar21 + -1 + uVar28) == '\0') {
              if ((uVar11 <= uVar10) || (*(char *)(lVar24 + -1 + uVar28) == '\0'))
              goto LAB_00114ad7;
              uVar8 = uVar28 | 1;
              if (((uVar16 != 0) && ((long)uVar8 < lVar26)) && (*(char *)(lVar22 + uVar8) != '\0'))
              {
                if (*(char *)((uVar28 - 2) + lVar21) == '\0') {
                  if (*(char *)(lVar22 + uVar28) != '\0') {
                    uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114eb2;
                  }
                  if (*(char *)(lVar22 + -1 + uVar28) != '\0') {
LAB_00114eea:
                    if ((uVar16 != 0) && (*(char *)(lVar9 + uVar28) != '\0')) {
                      uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                      do {
                        uVar30 = uVar23;
                        uVar23 = UF::P_[uVar30];
                        uVar13 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar30] < uVar30);
                      do {
                        uVar23 = uVar13;
                        uVar8 = (ulong)uVar23;
                        uVar13 = UF::P_[uVar8];
                      } while (UF::P_[uVar8] < uVar23);
                      if (uVar30 < uVar23) goto LAB_0011504a;
                      UF::P_[uVar30] = uVar23;
                      goto LAB_00115243;
                    }
                    uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                    do {
                      uVar30 = uVar23;
                      uVar23 = UF::P_[uVar30];
                      uVar13 = *(uint *)(lVar31 + uVar28 * 4);
                    } while (UF::P_[uVar30] < uVar30);
                    do {
                      uVar23 = uVar13;
                      uVar13 = UF::P_[uVar23];
                    } while (UF::P_[uVar23] < uVar23);
                    if (uVar30 < uVar23) {
                      UF::P_[uVar23] = uVar30;
                      uVar23 = uVar30;
                    }
                    else {
                      UF::P_[uVar30] = uVar23;
                    }
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                      uVar23 = puVar20[uVar8];
                    } while (puVar20[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = puVar20[uVar19];
                    } while (puVar20[uVar19] < uVar23);
                    goto LAB_0011541c;
                  }
                  uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar23 = UF::P_[uVar8];
                    uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                  } while (UF::P_[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = UF::P_[uVar19];
                  } while (UF::P_[uVar19] < uVar23);
                  goto LAB_00114b84;
                }
LAB_00114a97:
                if (uVar28 == 0 || uVar16 == 0) {
LAB_00114aab:
                  uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar23 = UF::P_[uVar8];
                    uVar30 = *(uint *)(lVar25 + (uVar28 - 2) * 4);
                  } while (UF::P_[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = UF::P_[uVar19];
                  } while (UF::P_[uVar19] < uVar23);
                  goto LAB_00114eb2;
                }
                if (*(char *)(lVar22 + -1 + uVar28) == '\0') {
LAB_00114e54:
                  if (*(char *)(lVar22 + -2 + uVar28) == '\0') goto LAB_00114aab;
                  if (*(char *)(lVar29 + uVar28) == '\0') {
                    uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar31 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114eb2;
                  }
                }
LAB_00114e70:
                if (uVar16 != 0) {
                  if (*(char *)(lVar22 + uVar28) != '\0') goto LAB_00114e80;
                  goto LAB_00114b0f;
                }
                goto LAB_00114e8e;
              }
              if (((lVar26 <= (long)uVar8) || (*(char *)(lVar21 + uVar8) == '\0')) ||
                 ((uVar16 == 0 ||
                  ((lVar26 <= (long)(uVar28 + 2) || (*(char *)(lVar22 + uVar28 + 2) == '\0')))))) {
                if (uVar16 != 0) {
                  if (*(char *)(lVar22 + -1 + uVar28) != '\0') {
                    uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                    if (*(char *)(lVar21 + -2 + uVar28) == '\0') {
                      do {
                        uVar13 = uVar23;
                        uVar8 = (ulong)uVar13;
                        uVar23 = UF::P_[uVar8];
                        uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar8] < uVar13);
                      do {
                        uVar23 = uVar30;
                        uVar19 = (ulong)uVar23;
                        uVar30 = UF::P_[uVar19];
                      } while (UF::P_[uVar19] < uVar23);
                      goto LAB_00114b84;
                    }
LAB_00114e0a:
                    *(uint *)(lVar25 + uVar28 * 4) = uVar23;
                    goto LAB_00115097;
                  }
                  if (*(char *)(lVar22 + uVar28) != '\0') {
                    if (*(char *)((uVar28 - 2) + lVar21) == '\0') {
                      uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                      do {
                        uVar13 = uVar23;
                        uVar8 = (ulong)uVar13;
                        uVar23 = UF::P_[uVar8];
                        uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar8] < uVar13);
                      do {
                        uVar23 = uVar30;
                        uVar19 = (ulong)uVar23;
                        uVar30 = UF::P_[uVar19];
                      } while (UF::P_[uVar19] < uVar23);
                      goto LAB_00114b84;
                    }
                    goto LAB_00114de9;
                  }
                }
                goto LAB_0011508e;
              }
              if (*(char *)(lVar21 + -2 + uVar28) == '\0') {
                if (*(char *)(lVar22 + uVar28) == '\0') {
                  if (*(char *)(lVar22 + -1 + uVar28) == '\0') {
                    uVar23 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114b84;
                  }
                  if (*(char *)(lVar9 + uVar8) != '\0') goto LAB_00114eea;
                  uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                  do {
                    uVar30 = uVar23;
                    uVar23 = UF::P_[uVar30];
                    uVar13 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                  } while (UF::P_[uVar30] < uVar30);
                  do {
                    uVar23 = uVar13;
                    uVar13 = UF::P_[uVar23];
                  } while (UF::P_[uVar23] < uVar23);
                  if (uVar30 < uVar23) {
                    UF::P_[uVar23] = uVar30;
                    uVar23 = uVar30;
                  }
                  else {
                    UF::P_[uVar30] = uVar23;
                  }
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    uVar23 = puVar20[uVar8];
                  } while (puVar20[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = puVar20[uVar19];
                  } while (puVar20[uVar19] < uVar23);
                }
                else {
                  uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                  if (*(char *)(lVar9 + uVar8) != '\0') {
                    do {
                      uVar30 = uVar23;
                      uVar23 = UF::P_[uVar30];
                      uVar13 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar30] < uVar30);
                    do {
                      uVar23 = uVar13;
                      uVar8 = (ulong)uVar23;
                      uVar13 = UF::P_[uVar8];
                    } while (UF::P_[uVar8] < uVar23);
                    if (uVar30 < uVar23) {
LAB_0011504a:
                      uVar23 = uVar30;
                      UF::P_[uVar8] = uVar23;
                    }
                    else {
                      UF::P_[uVar30] = uVar23;
                    }
LAB_00115243:
                    *(uint *)(lVar25 + uVar28 * 4) = uVar23;
                    goto LAB_00115097;
                  }
                  do {
                    uVar30 = uVar23;
                    uVar23 = UF::P_[uVar30];
                    uVar13 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                  } while (UF::P_[uVar30] < uVar30);
                  do {
                    uVar23 = uVar13;
                    uVar13 = UF::P_[uVar23];
                  } while (UF::P_[uVar23] < uVar23);
                  if (uVar30 < uVar23) {
                    UF::P_[uVar23] = uVar30;
                    uVar23 = uVar30;
                  }
                  else {
                    UF::P_[uVar30] = uVar23;
                  }
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    uVar23 = puVar20[uVar8];
                  } while (puVar20[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = puVar20[uVar19];
                  } while (puVar20[uVar19] < uVar23);
                }
LAB_0011541c:
                if (uVar13 < uVar23) {
                  puVar20[uVar19] = uVar13;
                  uVar23 = uVar13;
                }
                else {
                  puVar20[uVar8] = uVar23;
                }
                *(uint *)(lVar25 + uVar28 * 4) = uVar23;
                goto LAB_00115097;
              }
              if (*(char *)(lVar22 + -1 + uVar28) != '\0') {
                if (*(char *)(lVar9 + uVar8) == '\0') {
                  uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                  do {
                    uVar13 = uVar23;
                    uVar8 = (ulong)uVar13;
                    uVar23 = UF::P_[uVar8];
                    uVar30 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                  } while (UF::P_[uVar8] < uVar13);
                  do {
                    uVar23 = uVar30;
                    uVar19 = (ulong)uVar23;
                    uVar30 = UF::P_[uVar19];
                  } while (UF::P_[uVar19] < uVar23);
                  goto LAB_00114b84;
                }
                goto LAB_00114e70;
              }
              if (*(char *)(lVar9 + uVar8) != '\0') goto LAB_00114e54;
              if (*(char *)(lVar22 + uVar28) == '\0') {
                uVar23 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar23 = UF::P_[uVar8];
                  uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                } while (UF::P_[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = UF::P_[uVar19];
                } while (UF::P_[uVar19] < uVar23);
                goto LAB_00114b84;
              }
LAB_001150e5:
              lVar1 = uVar28 - 2;
              if ((uVar28 == 0 || uVar16 == 0) || (*(char *)(lVar22 + lVar1) == '\0')) {
                uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                do {
                  uVar30 = uVar23;
                  uVar23 = UF::P_[uVar30];
                  uVar13 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                } while (UF::P_[uVar30] < uVar30);
                do {
                  uVar23 = uVar13;
                  uVar13 = UF::P_[uVar23];
                } while (UF::P_[uVar23] < uVar23);
                if (uVar30 < uVar23) {
                  UF::P_[uVar23] = uVar30;
                  uVar23 = uVar30;
                }
                else {
                  UF::P_[uVar30] = uVar23;
                }
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar30 = *(uint *)(lVar25 + lVar1 * 4);
                  uVar23 = puVar20[uVar8];
                } while (puVar20[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = puVar20[uVar19];
                } while (puVar20[uVar19] < uVar23);
              }
              else if (*(char *)(lVar29 + uVar28) == '\0') {
                uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                do {
                  uVar30 = uVar23;
                  uVar23 = UF::P_[uVar30];
                  uVar13 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                } while (UF::P_[uVar30] < uVar30);
                do {
                  uVar23 = uVar13;
                  uVar13 = UF::P_[uVar23];
                } while (UF::P_[uVar23] < uVar23);
                if (uVar30 < uVar23) {
                  UF::P_[uVar23] = uVar30;
                  uVar23 = uVar30;
                }
                else {
                  UF::P_[uVar30] = uVar23;
                }
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar30 = *(uint *)(lVar25 + lVar1 * 4);
                  uVar23 = puVar20[uVar8];
                } while (puVar20[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = puVar20[uVar19];
                } while (puVar20[uVar19] < uVar23);
              }
              else {
                uVar23 = *(uint *)(lVar31 + lVar1 * 4);
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar23 = UF::P_[uVar8];
                  uVar30 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                } while (UF::P_[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = UF::P_[uVar19];
                } while (UF::P_[uVar19] < uVar23);
              }
              if (uVar13 < uVar23) goto LAB_00114eb7;
              puVar20[uVar8] = uVar23;
            }
            else {
              uVar8 = uVar28 | 1;
              if (((uVar16 == 0) || (lVar26 <= (long)uVar8)) || (*(char *)(lVar22 + uVar8) == '\0'))
              {
                if (((long)uVar8 < lVar26) && (*(char *)(lVar21 + uVar8) != '\0')) {
LAB_001149fe:
                  if ((uVar16 != 0) &&
                     (((long)(uVar28 + 2) < lVar26 && (*(char *)(lVar22 + uVar28 + 2) != '\0')))) {
                    if (*(char *)(lVar9 + 1 + uVar28) != '\0') goto LAB_001148dc;
                    uVar23 = *(uint *)(lVar31 + 8 + uVar28 * 4);
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114eb2;
                  }
                }
                goto LAB_0011508e;
              }
LAB_001148dc:
              if (*(char *)(lVar22 + uVar28) != '\0') goto LAB_00114ba2;
              if (*(char *)(lVar9 + uVar28) == '\0') {
                uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar23 = UF::P_[uVar8];
                  uVar30 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                } while (UF::P_[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = UF::P_[uVar19];
                } while (UF::P_[uVar19] < uVar23);
              }
              else {
LAB_001148f7:
                if (uVar28 != 0 && uVar16 != 0) {
                  if (*(char *)(lVar22 + -1 + uVar28) != '\0') goto LAB_00114e80;
LAB_00114de9:
                  if (*(char *)(lVar22 + -2 + uVar28) != '\0') {
                    uVar23 = *(uint *)(lVar31 + -8 + uVar28 * 4);
                    if (*(char *)(lVar29 + uVar28) != '\0') goto LAB_00114e0a;
                    do {
                      uVar13 = uVar23;
                      uVar8 = (ulong)uVar13;
                      uVar23 = UF::P_[uVar8];
                      uVar30 = *(uint *)(lVar31 + uVar28 * 4);
                    } while (UF::P_[uVar8] < uVar13);
                    do {
                      uVar23 = uVar30;
                      uVar19 = (ulong)uVar23;
                      uVar30 = UF::P_[uVar19];
                    } while (UF::P_[uVar19] < uVar23);
                    goto LAB_00114eb2;
                  }
                }
                uVar23 = *(uint *)(lVar31 + uVar28 * 4);
                do {
                  uVar13 = uVar23;
                  uVar8 = (ulong)uVar13;
                  uVar23 = UF::P_[uVar8];
                  uVar30 = *(uint *)(lVar25 + (uVar28 - 2) * 4);
                } while (UF::P_[uVar8] < uVar13);
                do {
                  uVar23 = uVar30;
                  uVar19 = (ulong)uVar23;
                  uVar30 = UF::P_[uVar19];
                } while (UF::P_[uVar19] < uVar23);
              }
LAB_00114eb2:
              if (uVar13 < uVar23) {
LAB_00114eb7:
                uVar23 = uVar13;
                puVar20[uVar19] = uVar23;
              }
              else {
                UF::P_[uVar8] = uVar23;
              }
            }
LAB_00114ec3:
            *(uint *)(lVar25 + uVar28 * 4) = uVar23;
          }
LAB_00115097:
          uVar28 = uVar28 + 2;
        } while ((long)uVar28 < lVar26);
      }
      puVar20 = UF::P_;
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar11);
    uVar13 = 1;
    if (1 < UF::length_) {
      uVar13 = 1;
      uVar11 = 1;
      do {
        if (puVar20[uVar11] < uVar11) {
          uVar23 = puVar20[puVar20[uVar11]];
        }
        else {
          uVar23 = uVar13;
          uVar13 = uVar13 + 1;
        }
        puVar20[uVar11] = uVar23;
        uVar11 = uVar11 + 1;
      } while (uVar11 < UF::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  puVar20 = UF::P_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar23 = *(uint *)&pMVar5->field_0x8;
  uVar14 = uVar23 & 0xfffffffe;
  uVar13 = *(uint *)&pMVar5->field_0xc;
  local_e8 = uVar13 & 0x80000001;
  uVar16 = (long)(int)uVar13 & 0xfffffffffffffffe;
  uVar11 = 0;
  uVar30 = 0;
  iVar18 = (int)uVar16;
  if (0 < (int)uVar14) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar9 = *(long *)&pMVar4->field_0x10;
    lVar21 = **(long **)&pMVar4->field_0x48;
    lVar22 = *(long *)&pMVar5->field_0x10;
    lVar25 = **(long **)&pMVar5->field_0x48;
    lVar29 = lVar22 + lVar25;
    lVar24 = lVar9 + 1 + lVar21;
    lVar26 = lVar9 + 1;
    uVar11 = 0;
    lVar31 = lVar22;
    do {
      puVar6 = UF::P_;
      lVar32 = lVar25 * uVar11 + lVar22;
      lVar1 = lVar32 + lVar25;
      if (iVar18 < 1) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        do {
          lVar27 = (long)*(int *)(lVar31 + uVar10 * 4);
          if (lVar27 < 1) {
            *(undefined8 *)(lVar31 + uVar10 * 4) = 0;
            uVar28 = uVar10 + 1;
            *(undefined4 *)(lVar29 + uVar10 * 4) = 0;
            uVar15 = 0;
          }
          else {
            uVar15 = puVar6[lVar27];
            uVar12 = uVar15;
            if (*(char *)(lVar26 + -1 + uVar10) == '\0') {
              uVar12 = 0;
            }
            *(uint *)(lVar31 + uVar10 * 4) = uVar12;
            uVar28 = uVar10 | 1;
            uVar12 = uVar15;
            if (*(char *)(lVar26 + uVar10) == '\0') {
              uVar12 = uVar30;
            }
            *(uint *)(lVar31 + 4 + uVar10 * 4) = uVar12;
            uVar12 = uVar15;
            if (*(char *)(lVar24 + -1 + uVar10) == '\0') {
              uVar12 = uVar30;
            }
            *(uint *)(lVar29 + uVar10 * 4) = uVar12;
            if (*(char *)(lVar24 + uVar10) == '\0') {
              uVar15 = uVar30;
            }
          }
          *(uint *)(lVar1 + uVar28 * 4) = uVar15;
          uVar10 = uVar10 + 2;
        } while ((long)uVar10 < (long)uVar16);
      }
      if (local_e8 == 1) {
        lVar27 = (long)*(int *)(lVar32 + uVar10 * 4);
        if (lVar27 < 1) {
          *(undefined4 *)(lVar32 + uVar10 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar10 * 4) = 0;
        }
        else {
          lVar17 = lVar21 * uVar11 + lVar9;
          uVar15 = puVar20[lVar27];
          uVar12 = uVar15;
          if (*(char *)(lVar17 + uVar10) == '\0') {
            uVar12 = uVar30;
          }
          *(uint *)(lVar32 + uVar10 * 4) = uVar12;
          if (*(char *)(lVar17 + lVar21 + uVar10) == '\0') {
            *(undefined4 *)(lVar1 + uVar10 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar10 * 4) = uVar15;
          }
        }
      }
      uVar11 = uVar11 + 2;
      lVar29 = lVar29 + lVar25 * 2;
      lVar24 = lVar24 + lVar21 * 2;
      lVar26 = lVar26 + lVar21 * 2;
      lVar31 = lVar31 + lVar25 * 2;
    } while (uVar11 < uVar14);
    uVar11 = uVar11 & 0xffffffff;
  }
  puVar20 = UF::P_;
  if ((uVar23 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar26 = *(long *)&pMVar4->field_0x10;
    lVar9 = **(long **)&pMVar4->field_0x48 * uVar11;
    lVar29 = *(long *)&pMVar5->field_0x10;
    lVar24 = uVar11 * **(long **)&pMVar5->field_0x48;
    if (iVar18 < 1) {
      uVar11 = 0;
    }
    else {
      lVar21 = lVar9 + lVar26;
      lVar22 = lVar24 + lVar29;
      uVar11 = 0;
      do {
        lVar25 = (long)*(int *)(lVar22 + uVar11 * 4);
        if (lVar25 < 1) {
          *(undefined8 *)(lVar22 + uVar11 * 4) = 0;
        }
        else {
          uVar23 = puVar20[lVar25];
          uVar30 = uVar23;
          if (*(char *)(lVar21 + uVar11) == '\0') {
            uVar30 = 0;
          }
          *(uint *)(lVar22 + uVar11 * 4) = uVar30;
          if (*(char *)(lVar21 + 1 + uVar11) == '\0') {
            *(undefined4 *)(lVar22 + 4 + uVar11 * 4) = 0;
          }
          else {
            *(uint *)(lVar22 + 4 + uVar11 * 4) = uVar23;
          }
        }
        uVar11 = uVar11 + 2;
      } while (uVar11 < ((long)(int)uVar13 & 0xfffffffeU));
    }
    puVar20 = UF::P_;
    if (local_e8 == 1) {
      lVar29 = lVar29 + lVar24;
      lVar24 = (long)*(int *)(lVar29 + uVar11 * 4);
      if ((0 < lVar24) && (*(char *)(lVar26 + lVar9 + uVar11) != '\0')) {
        *(uint *)(lVar29 + uVar11 * 4) = UF::P_[lVar24];
        goto LAB_00115752;
      }
      *(undefined4 *)(lVar29 + uVar11 * 4) = 0;
    }
  }
  puVar20 = UF::P_;
  if (UF::P_ == (uint *)0x0) {
    return;
  }
LAB_00115752:
  operator_delete__(puVar20);
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }